

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O3

vrna_exp_param_t * get_scaled_pf_parameters(void)

{
  vrna_exp_param_t *pvVar1;
  vrna_md_t md;
  vrna_md_t local_7f0;
  
  set_model_details(&local_7f0);
  pvVar1 = get_scaled_exp_params(&local_7f0,-1.0);
  pvVar1->pf_scale = pf_scale;
  return pvVar1;
}

Assistant:

PUBLIC vrna_exp_param_t *
get_scaled_pf_parameters(void)
{
  vrna_md_t         md;
  vrna_exp_param_t  *pf;

  set_model_details(&md);

  pf            = vrna_exp_params(&md);
  pf->pf_scale  = pf_scale;

  return pf;
}